

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zStream.c
# Opt level: O0

SRes LookInStream_Read2(ILookInStream *stream,void *buf,size_t size,SRes errorType)

{
  int iVar1;
  SRes in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int __result__;
  size_t processed;
  long local_30;
  SRes local_24;
  long local_20;
  long local_18;
  long local_10;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    if (local_20 == 0) {
      return 0;
    }
    local_30 = local_20;
    iVar1 = (**(code **)(local_10 + 0x10))(local_10,local_18,&local_30);
    if (iVar1 != 0) break;
    if (local_30 == 0) {
      return local_24;
    }
    local_18 = local_18 + local_30;
    local_20 = local_20 - local_30;
  }
  return iVar1;
}

Assistant:

SRes LookInStream_Read2(ILookInStream *stream, void *buf, size_t size, SRes errorType)
{
  while (size != 0)
  {
    size_t processed = size;
    RINOK(stream->Read(stream, buf, &processed));
    if (processed == 0)
      return errorType;
    buf = (void *)((Byte *)buf + processed);
    size -= processed;
  }
  return SZ_OK;
}